

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx,uint8_t *ids,size_t ids_len)

{
  bool bVar1;
  uint uVar2;
  ptrdiff_t _Num;
  Span<const_unsigned_char> in;
  Array<unsigned_char> copy;
  Array<unsigned_char> local_38;
  
  in.size_ = ids_len;
  in.data_ = (uchar *)ids_len;
  bVar1 = bssl::ssl_is_valid_trust_anchor_list((bssl *)ids,in);
  if (bVar1) {
    local_38.data_ = (uchar *)0x0;
    local_38.size_ = 0;
    bVar1 = bssl::Array<unsigned_char>::InitUninitialized(&local_38,ids_len);
    if (bVar1 && ids_len != 0) {
      memmove(local_38.data_,ids,ids_len);
    }
    if (bVar1) {
      std::optional<bssl::Array<unsigned_char>>::operator=
                ((optional<bssl::Array<unsigned_char>> *)&ctx->requested_trust_anchors,&local_38);
    }
    uVar2 = (uint)bVar1;
    OPENSSL_free(local_38.data_);
  }
  else {
    uVar2 = 0;
    ERR_put_error(0x10,0,0x148,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0xd58);
  }
  return uVar2;
}

Assistant:

int SSL_CTX_set1_requested_trust_anchors(SSL_CTX *ctx, const uint8_t *ids,
                                         size_t ids_len) {
  auto span = Span(ids, ids_len);
  if (!ssl_is_valid_trust_anchor_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_TRUST_ANCHOR_LIST);
    return 0;
  }
  Array<uint8_t> copy;
  if (!copy.CopyFrom(span)) {
    return 0;
  }
  ctx->requested_trust_anchors = std::move(copy);
  return 1;
}